

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::BuildTLAS(DeviceContextVkImpl *this,BuildTLASAttribs *Attribs)

{
  Uint64 UVar1;
  bool bVar2;
  VkGeometryInstanceFlagsKHR VVar3;
  TopLevelASVkImpl *TLAS;
  BufferVkImpl *Buffer;
  BufferVkImpl *pBuffVk;
  TopLevelASDesc *pTVar4;
  TLASBuildInstanceData *pTVar5;
  Char *pCVar6;
  VkBuffer __dest;
  BottomLevelASVkImpl *this_00;
  VkDeviceAddress VVar7;
  RenderDeviceVkImpl *this_01;
  VulkanPhysicalDevice *this_02;
  ExtensionProperties *pEVar8;
  undefined1 local_1e0 [8];
  string msg_2;
  VkPhysicalDeviceAccelerationStructurePropertiesKHR *ASLimits;
  string msg_1;
  VkAccelerationStructureGeometryInstancesDataKHR *vkASInst;
  VkAccelerationStructureGeometryKHR vkASGeometry;
  VkAccelerationStructureBuildRangeInfoKHR *vkRangePtr;
  VkAccelerationStructureBuildRangeInfoKHR vkRange;
  VkAccelerationStructureBuildGeometryInfoKHR vkASBuildInfo;
  BottomLevelASVkImpl *pBLASVk;
  VkAccelerationStructureInstanceKHR *vkASInst_1;
  undefined1 local_a8 [8];
  string msg;
  TLASInstanceDesc InstDesc;
  TLASBuildInstanceData *Inst;
  undefined1 auStack_68 [4];
  Uint32 i;
  VulkanUploadAllocation TmpSpace;
  size_t Size;
  char *OpName;
  TopLevelASDesc *TLASDesc;
  BufferVkImpl *pInstancesVk;
  BufferVkImpl *pScratchVk;
  TopLevelASVkImpl *pTLASVk;
  BuildTLASAttribs *Attribs_local;
  DeviceContextVkImpl *this_local;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::BuildTLAS
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Attribs,0);
  TLAS = ClassPtrCast<Diligent::TopLevelASVkImpl,Diligent::ITopLevelAS>(Attribs->pTLAS);
  Buffer = ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>(Attribs->pScratchBuffer);
  pBuffVk = ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>(Attribs->pInstanceBuffer);
  pTVar4 = DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
           ::GetDesc((DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
                      *)TLAS);
  EnsureVkCmdBuffer(this);
  TransitionOrVerifyTLASState
            (this,TLAS,Attribs->TLASTransitionMode,RESOURCE_STATE_BUILD_AS_WRITE,
             "Build TopLevelAS (DeviceContextVkImpl::BuildTLAS)");
  TransitionOrVerifyBufferState
            (this,Buffer,Attribs->ScratchBufferTransitionMode,RESOURCE_STATE_BUILD_AS_WRITE,
             VK_ACCESS_ACCELERATION_STRUCTURE_WRITE_BIT_KHR,
             "Build TopLevelAS (DeviceContextVkImpl::BuildTLAS)");
  if ((Attribs->Update & 1U) == 0) {
    bVar2 = TopLevelASBase<Diligent::EngineVkImplTraits>::SetInstanceData
                      (&TLAS->super_TopLevelASBase<Diligent::EngineVkImplTraits>,Attribs->pInstances
                       ,Attribs->InstanceCount,Attribs->BaseContributionToHitGroupIndex,
                       Attribs->HitGroupStride,Attribs->BindingMode);
  }
  else {
    bVar2 = TopLevelASBase<Diligent::EngineVkImplTraits>::UpdateInstances
                      (&TLAS->super_TopLevelASBase<Diligent::EngineVkImplTraits>,Attribs->pInstances
                       ,Attribs->InstanceCount,Attribs->BaseContributionToHitGroupIndex,
                       Attribs->HitGroupStride,Attribs->BindingMode);
  }
  if (bVar2) {
    TmpSpace.AlignedOffset = (ulong)Attribs->InstanceCount << 6;
    VulkanUploadHeap::Allocate
              ((VulkanUploadAllocation *)auStack_68,&this->m_UploadHeap,TmpSpace.AlignedOffset,0x10)
    ;
    for (Inst._4_4_ = 0; Inst._4_4_ < Attribs->InstanceCount; Inst._4_4_ = Inst._4_4_ + 1) {
      pTVar5 = Attribs->pInstances + Inst._4_4_;
      join_0x00000010_0x00000000_ =
           TopLevelASBase<Diligent::EngineVkImplTraits>::GetInstanceDesc
                     (&TLAS->super_TopLevelASBase<Diligent::EngineVkImplTraits>,pTVar5->InstanceName
                     );
      if (Attribs->InstanceCount <= (uint)msg.field_2._12_4_) {
        FormatString<char[32]>((string *)local_a8,(char (*) [32])"Failed to find instance by name");
        pCVar6 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar6,"BuildTLAS",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0xe88);
        std::__cxx11::string::~string((string *)local_a8);
        return;
      }
      __dest = TmpSpace.vkBuffer + (ulong)(uint)msg.field_2._12_4_ * 0x40;
      this_00 = ClassPtrCast<Diligent::BottomLevelASVkImpl,Diligent::IBottomLevelAS>(pTVar5->pBLAS);
      memcpy(__dest,&pTVar5->Transform,0x30);
      *(ulong *)(__dest + 0x30) =
           *(ulong *)(__dest + 0x30) & 0xffffffffff000000 | (ulong)pTVar5->CustomId & 0xffffff;
      *(ulong *)(__dest + 0x30) =
           *(ulong *)(__dest + 0x30) & 0xff000000ffffffff |
           ((ulong)(uint)msg.field_2._8_4_ & 0xffffff) << 0x20;
      *(ulong *)(__dest + 0x30) =
           *(ulong *)(__dest + 0x30) & 0xffffffff00ffffff | (ulong)pTVar5->Mask << 0x18;
      VVar3 = InstanceFlagsToVkGeometryInstanceFlags(pTVar5->Flags);
      *(ulong *)(__dest + 0x30) =
           *(ulong *)(__dest + 0x30) & 0xffffffffffffff | (ulong)VVar3 << 0x38;
      VVar7 = BottomLevelASVkImpl::GetVkDeviceAddress(this_00);
      *(VkDeviceAddress *)(__dest + 0x38) = VVar7;
      TransitionOrVerifyBLASState
                (this,this_00,Attribs->BLASTransitionMode,RESOURCE_STATE_BUILD_AS_READ,
                 "Build TopLevelAS (DeviceContextVkImpl::BuildTLAS)");
    }
    UpdateBufferRegion(this,pBuffVk,Attribs->InstanceBufferOffset,TmpSpace.AlignedOffset,_auStack_68
                       ,TmpSpace.Size,Attribs->InstanceBufferTransitionMode);
    TransitionOrVerifyBufferState
              (this,pBuffVk,Attribs->InstanceBufferTransitionMode,RESOURCE_STATE_BUILD_AS_READ,
               VK_ACCESS_SHADER_READ_BIT,"Build TopLevelAS (DeviceContextVkImpl::BuildTLAS)");
    memset(&vkRange.firstVertex,0,0x50);
    memset(&vkRangePtr,0,0x10);
    vkASGeometry._88_8_ = &vkRangePtr;
    memset(&vkASInst,0,0x60);
    vkRangePtr._0_4_ = Attribs->InstanceCount;
    vkASInst._0_4_ = 0x3b9d13f6;
    vkASGeometry.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    vkASGeometry._4_4_ = 0;
    vkASGeometry.pNext._0_4_ = 2;
    vkASGeometry.geometry._56_4_ = 0;
    msg_1.field_2._8_8_ = &vkASGeometry.geometryType;
    vkASGeometry.geometryType = 0x3b9d13f4;
    vkASGeometry.geometry._0_8_ = 0;
    vkASGeometry.geometry._8_4_ = 0;
    VVar7 = BufferVkImpl::GetVkDeviceAddress(pBuffVk);
    *(VkDeviceAddress *)(msg_1.field_2._8_8_ + 0x18) = VVar7 + Attribs->InstanceBufferOffset;
    if ((*(ulong *)(msg_1.field_2._8_8_ + 0x18) & 0xf) != 0) {
      FormatString<char[46]>
                ((string *)&ASLimits,(char (*) [46])"Instance data address is not properly aligned")
      ;
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"BuildTLAS",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xeb2);
      std::__cxx11::string::~string((string *)&ASLimits);
    }
    vkRange.firstVertex = 0x3b9d13f0;
    BuildASFlagsToVkBuildAccelerationStructureFlags(pTVar4->Flags);
    if ((Attribs->Update & 1U) != 0) {
      TopLevelASVkImpl::GetVkTLAS(TLAS);
    }
    TopLevelASVkImpl::GetVkTLAS(TLAS);
    VVar7 = BufferVkImpl::GetVkDeviceAddress(Buffer);
    UVar1 = Attribs->ScratchBufferOffset;
    this_01 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->
                        (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice);
    this_02 = RenderDeviceVkImpl::GetPhysicalDevice(this_01);
    pEVar8 = VulkanUtilities::VulkanPhysicalDevice::GetExtProperties(this_02);
    msg_2.field_2._8_8_ = &pEVar8->AccelStruct;
    if ((VVar7 + UVar1) %
        (ulong)(pEVar8->AccelStruct).minAccelerationStructureScratchOffsetAlignment != 0) {
      FormatString<char[53]>
                ((string *)local_1e0,
                 (char (*) [53])"Scratch buffer start address is not properly aligned");
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"BuildTLAS",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xec0);
      std::__cxx11::string::~string((string *)local_1e0);
    }
    VulkanUtilities::VulkanCommandBuffer::BuildAccelerationStructure
              (&this->m_CommandBuffer,1,
               (VkAccelerationStructureBuildGeometryInfoKHR *)&vkRange.firstVertex,
               (VkAccelerationStructureBuildRangeInfoKHR **)&vkASGeometry.flags);
    (this->m_State).NumCommands = (this->m_State).NumCommands + 1;
  }
  return;
}

Assistant:

void DeviceContextVkImpl::BuildTLAS(const BuildTLASAttribs& Attribs)
{
    TDeviceContextBase::BuildTLAS(Attribs, 0);

    static_assert(TLAS_INSTANCE_DATA_SIZE == sizeof(VkAccelerationStructureInstanceKHR), "Value in TLAS_INSTANCE_DATA_SIZE doesn't match the actual instance description size");

    TopLevelASVkImpl*     pTLASVk      = ClassPtrCast<TopLevelASVkImpl>(Attribs.pTLAS);
    BufferVkImpl*         pScratchVk   = ClassPtrCast<BufferVkImpl>(Attribs.pScratchBuffer);
    BufferVkImpl*         pInstancesVk = ClassPtrCast<BufferVkImpl>(Attribs.pInstanceBuffer);
    const TopLevelASDesc& TLASDesc     = pTLASVk->GetDesc();

    EnsureVkCmdBuffer();

    const char* OpName = "Build TopLevelAS (DeviceContextVkImpl::BuildTLAS)";
    TransitionOrVerifyTLASState(*pTLASVk, Attribs.TLASTransitionMode, RESOURCE_STATE_BUILD_AS_WRITE, OpName);
    TransitionOrVerifyBufferState(*pScratchVk, Attribs.ScratchBufferTransitionMode, RESOURCE_STATE_BUILD_AS_WRITE, VK_ACCESS_ACCELERATION_STRUCTURE_WRITE_BIT_KHR, OpName);

    if (Attribs.Update)
    {
        if (!pTLASVk->UpdateInstances(Attribs.pInstances, Attribs.InstanceCount, Attribs.BaseContributionToHitGroupIndex, Attribs.HitGroupStride, Attribs.BindingMode))
            return;
    }
    else
    {
        if (!pTLASVk->SetInstanceData(Attribs.pInstances, Attribs.InstanceCount, Attribs.BaseContributionToHitGroupIndex, Attribs.HitGroupStride, Attribs.BindingMode))
            return;
    }

    // copy instance data into instance buffer
    {
        size_t                 Size     = Attribs.InstanceCount * sizeof(VkAccelerationStructureInstanceKHR);
        VulkanUploadAllocation TmpSpace = m_UploadHeap.Allocate(Size, 16);

        for (Uint32 i = 0; i < Attribs.InstanceCount; ++i)
        {
            const TLASBuildInstanceData& Inst     = Attribs.pInstances[i];
            const TLASInstanceDesc       InstDesc = pTLASVk->GetInstanceDesc(Inst.InstanceName);

            if (InstDesc.InstanceIndex >= Attribs.InstanceCount)
            {
                UNEXPECTED("Failed to find instance by name");
                return;
            }

            VkAccelerationStructureInstanceKHR& vkASInst = static_cast<VkAccelerationStructureInstanceKHR*>(TmpSpace.CPUAddress)[InstDesc.InstanceIndex];
            BottomLevelASVkImpl*                pBLASVk  = ClassPtrCast<BottomLevelASVkImpl>(Inst.pBLAS);

            static_assert(sizeof(vkASInst.transform) == sizeof(Inst.Transform), "size mismatch");
            std::memcpy(&vkASInst.transform, Inst.Transform.data, sizeof(vkASInst.transform));

            vkASInst.instanceCustomIndex                    = Inst.CustomId;
            vkASInst.instanceShaderBindingTableRecordOffset = InstDesc.ContributionToHitGroupIndex;
            vkASInst.mask                                   = Inst.Mask;
            vkASInst.flags                                  = InstanceFlagsToVkGeometryInstanceFlags(Inst.Flags);
            vkASInst.accelerationStructureReference         = pBLASVk->GetVkDeviceAddress();

            TransitionOrVerifyBLASState(*pBLASVk, Attribs.BLASTransitionMode, RESOURCE_STATE_BUILD_AS_READ, OpName);
        }

        UpdateBufferRegion(pInstancesVk, Attribs.InstanceBufferOffset, Size, TmpSpace.vkBuffer, TmpSpace.AlignedOffset, Attribs.InstanceBufferTransitionMode);
    }
    TransitionOrVerifyBufferState(*pInstancesVk, Attribs.InstanceBufferTransitionMode, RESOURCE_STATE_BUILD_AS_READ, VK_ACCESS_SHADER_READ_BIT, OpName);

    VkAccelerationStructureBuildGeometryInfoKHR     vkASBuildInfo = {};
    VkAccelerationStructureBuildRangeInfoKHR        vkRange       = {};
    VkAccelerationStructureBuildRangeInfoKHR const* vkRangePtr    = &vkRange;
    VkAccelerationStructureGeometryKHR              vkASGeometry  = {};

    vkRange.primitiveCount = Attribs.InstanceCount;

    vkASGeometry.sType        = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
    vkASGeometry.pNext        = nullptr;
    vkASGeometry.geometryType = VK_GEOMETRY_TYPE_INSTANCES_KHR;
    vkASGeometry.flags        = 0;

    VkAccelerationStructureGeometryInstancesDataKHR& vkASInst{vkASGeometry.geometry.instances};
    vkASInst.sType              = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_INSTANCES_DATA_KHR;
    vkASInst.pNext              = nullptr;
    vkASInst.arrayOfPointers    = VK_FALSE;
    vkASInst.data.deviceAddress = pInstancesVk->GetVkDeviceAddress() + Attribs.InstanceBufferOffset;

    // if geometry.arrayOfPointers is VK_FALSE, geometry.instances.data.deviceAddress must be aligned to 16 bytes
    VERIFY(vkASInst.data.deviceAddress % 16 == 0, "Instance data address is not properly aligned");

    vkASBuildInfo.sType                     = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_GEOMETRY_INFO_KHR;
    vkASBuildInfo.type                      = VK_ACCELERATION_STRUCTURE_TYPE_TOP_LEVEL_KHR;                    // type must be compatible with create info
    vkASBuildInfo.flags                     = BuildASFlagsToVkBuildAccelerationStructureFlags(TLASDesc.Flags); // flags must be compatible with create info
    vkASBuildInfo.mode                      = Attribs.Update ? VK_BUILD_ACCELERATION_STRUCTURE_MODE_UPDATE_KHR : VK_BUILD_ACCELERATION_STRUCTURE_MODE_BUILD_KHR;
    vkASBuildInfo.srcAccelerationStructure  = Attribs.Update ? pTLASVk->GetVkTLAS() : VK_NULL_HANDLE;
    vkASBuildInfo.dstAccelerationStructure  = pTLASVk->GetVkTLAS();
    vkASBuildInfo.geometryCount             = 1;
    vkASBuildInfo.pGeometries               = &vkASGeometry;
    vkASBuildInfo.ppGeometries              = nullptr;
    vkASBuildInfo.scratchData.deviceAddress = pScratchVk->GetVkDeviceAddress() + Attribs.ScratchBufferOffset;

    const VkPhysicalDeviceAccelerationStructurePropertiesKHR& ASLimits = m_pDevice->GetPhysicalDevice().GetExtProperties().AccelStruct;
    VERIFY(vkASBuildInfo.scratchData.deviceAddress % ASLimits.minAccelerationStructureScratchOffsetAlignment == 0, "Scratch buffer start address is not properly aligned");

    m_CommandBuffer.BuildAccelerationStructure(1, &vkASBuildInfo, &vkRangePtr);
    ++m_State.NumCommands;
}